

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_gl.c
# Opt level: O2

int main(void)

{
  FILE *__stream;
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  uint uVar4;
  EGLDisplay pvVar5;
  long lVar6;
  undefined8 uVar7;
  char *pcVar8;
  EGLConfig cfg;
  undefined1 local_c [4];
  
  (*_epoxy_glXGetCurrentContext)();
  (*_epoxy_eglGetCurrentContext)();
  pvVar5 = get_egl_display_or_skip();
  cVar1 = epoxy_has_egl_extension(pvVar5,"EGL_KHR_surfaceless_context");
  if (cVar1 == '\0') {
    pcVar8 = "Test requires EGL_KHR_surfaceless_context";
  }
  else {
    iVar2 = (*_epoxy_eglBindAPI)(0x30a2);
    if (iVar2 == 0) {
      pcVar8 = "Couldn\'t initialize EGL with desktop GL\n";
    }
    else {
      iVar2 = (*_epoxy_eglChooseConfig)(pvVar5,init_egl_config_attribs,&cfg,1,local_c);
      if (iVar2 == 0) {
        pcVar8 = "Couldn\'t get an EGLConfig\n";
      }
      else {
        lVar6 = (*_epoxy_eglCreateContext)(pvVar5,cfg,0,init_egl_context_attribs);
        if (lVar6 != 0) {
          (*_epoxy_eglMakeCurrent)(pvVar5,0,0,lVar6);
          cVar1 = epoxy_is_desktop_gl();
          if (cVar1 == '\0') {
            fwrite("Claimed to be desktop\n",0x16,1,_stderr);
          }
          iVar2 = epoxy_gl_version();
          __stream = _stderr;
          if (iVar2 < 0x14) {
            uVar4 = epoxy_gl_version();
            fprintf(__stream,"Claimed to be GL version %d\n",(ulong)uVar4);
          }
          uVar7 = (*_epoxy_glGetString)(0x1f02);
          printf("GL version: %s\n",uVar7);
          uVar3 = (*_epoxy_glCreateShader)(0x8b30);
          cVar1 = (*_epoxy_glIsShader)(uVar3);
          return (int)(cVar1 == '\0');
        }
        pcVar8 = "Couldn\'t create a GL context\n";
      }
    }
  }
  errx(0x4d,pcVar8);
  halt_baddata();
}

Assistant:

int main(void)
{
    bool pass = true;
    EGLDisplay egl_dpy;
    EGLContext egl_ctx;

    /* Force epoxy to have loaded both EGL and GLX libs already -- we
     * can't assume anything about symbol resolution based on having
     * EGL or GLX loaded.
     */
    (void)glXGetCurrentContext();
    (void)eglGetCurrentContext();

    init_egl(&egl_dpy, &egl_ctx);
    pass = make_egl_current_and_test(egl_dpy, egl_ctx) && pass;

    return pass != true;
}